

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

longdouble *
trng::math::detail::GammaPQ_asympt_R<long_double>
          (longdouble a,longdouble eta,longdouble eta_squard_half)

{
  longdouble *extraout_RAX;
  size_t in_RSI;
  unkbyte10 in_ST1;
  longdouble lVar1;
  longdouble lVar2;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar6;
  longdouble in_stack_00000008;
  longdouble in_stack_00000018;
  longdouble y_old;
  size_t i_1;
  longdouble y;
  longdouble eta_to_the_i;
  ptrdiff_t i;
  longdouble beta [31];
  size_t n;
  GammaPQ_asympt_coefficients<long_double> coeffs;
  ulong local_270;
  longdouble local_268;
  longdouble local_258;
  long local_240;
  longdouble alStack_238 [29];
  unkbyte10 local_68;
  undefined8 local_48;
  longdouble local_28;
  longdouble local_18;
  
  local_18 = in_stack_00000008;
  local_28 = in_stack_00000018;
  local_48 = 0x1f;
  lVar2 = in_ST4;
  lVar3 = in_ST4;
  lVar4 = in_ST4;
  GammaPQ_asympt_coefficients<long_double>::get((longdouble *)0x1f,in_RSI);
  GammaPQ_asympt_coefficients<long_double>::get((longdouble *)0x1e,in_RSI);
  local_68 = in_ST1;
  dVar6 = extraout_XMM0_Qa;
  for (local_240 = 0x1c; -1 < local_240; local_240 = local_240 + -1) {
    lVar1 = ((longdouble)(local_240 + 2) * alStack_238[local_240 + 2]) / local_18;
    lVar5 = lVar4;
    GammaPQ_asympt_coefficients<long_double>::get((longdouble *)(local_240 + 1),in_RSI);
    alStack_238[local_240] = lVar1 + in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = lVar2;
    lVar2 = lVar3;
    lVar3 = lVar4;
    lVar4 = lVar5;
    dVar6 = extraout_XMM0_Qa_00;
  }
  local_258 = (longdouble)1;
  local_268 = (longdouble)0;
  for (local_270 = 0; local_270 < 0x1f; local_270 = local_270 + 1) {
    lVar2 = alStack_238[local_270] * local_258 + local_268;
    if ((lVar2 == local_268) && (!NAN(lVar2) && !NAN(local_268))) break;
    local_258 = local_258 * local_28;
    local_268 = lVar2;
  }
  dVar6 = std::exp(dVar6);
  std::sqrt(dVar6);
  return extraout_RAX;
}

Assistant:

TRNG_CUDA_ENABLE T GammaPQ_asympt_R(T a, T eta, T eta_squard_half) {
        GammaPQ_asympt_coefficients<T> coeffs;
        constexpr std::size_t n{coeffs.max_index() - 1};
        T beta[n];
        beta[n - 1] = coeffs.get(n);
        beta[n - 2] = coeffs.get(n - 1);
        for (std::ptrdiff_t i{n - 3}; i >= 0; --i)
          beta[i] = beta[i + 2] * (i + 2) / a + coeffs.get(i + 1);
        T eta_to_the_i{1};
        T y{0};
        for (std::size_t i{0}; i < n; ++i) {
          const T y_old{y};
          y += beta[i] * eta_to_the_i;
          if (y == y_old)
            break;
          eta_to_the_i *= eta;
        }
        return y / (1 + beta[1] / a) * exp(-a * eta_squard_half) / sqrt(a) *
               constants<T>::one_over_sqrt_2pi;
      }